

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

SUNErrCode
N_VLinearCombinationVectorArray_Serial(int nvec,int nsum,sunrealtype *c,N_Vector **X,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  long *in_RCX;
  double *in_RDX;
  int in_ESI;
  int in_EDI;
  sunrealtype *in_R8;
  N_Vector *Y;
  sunrealtype *ctmp;
  sunrealtype *xd;
  sunrealtype *zd;
  sunindextype N;
  sunindextype k;
  int j;
  int i;
  SUNContext_conflict sunctx_local_scope_;
  N_Vector in_stack_ffffffffffffffb8;
  sunrealtype in_stack_ffffffffffffffc0;
  long lVar4;
  long lVar5;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar6;
  int iVar7;
  N_Vector *X_00;
  
  X_00 = *(N_Vector **)(*(long *)*in_RCX + 0x10);
  if (in_EDI == 1) {
    if (in_ESI == 1) {
      N_VScale_Serial(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(N_Vector)0x0);
    }
    else if (in_ESI == 2) {
      N_VLinearSum_Serial((sunrealtype)Z,(N_Vector)sunctx_local_scope_,(sunrealtype)_j,(N_Vector)k,
                          (N_Vector)N);
    }
    else {
      pvVar3 = malloc((long)in_ESI << 3);
      for (iVar6 = 0; iVar6 < in_ESI; iVar6 = iVar6 + 1) {
        *(undefined8 *)((long)pvVar3 + (long)iVar6 * 8) = *(undefined8 *)in_RCX[iVar6];
      }
      N_VLinearCombination_Serial
                ((int)in_RCX,in_R8,X_00,(N_Vector)CONCAT44(iVar6,in_stack_ffffffffffffffc8));
      free(pvVar3);
    }
  }
  else if (in_ESI == 1) {
    pvVar3 = malloc((long)in_EDI << 3);
    for (iVar6 = 0; iVar6 < in_EDI; iVar6 = iVar6 + 1) {
      *(double *)((long)pvVar3 + (long)iVar6 * 8) = *in_RDX;
    }
    N_VScaleVectorArray_Serial
              ((int)in_RCX,in_R8,X_00,(N_Vector *)CONCAT44(in_stack_ffffffffffffffcc,iVar6));
    free(pvVar3);
  }
  else if (in_ESI == 2) {
    N_VLinearSumVectorArray_Serial
              ((int)c,(sunrealtype)X,Z,(sunrealtype)sunctx_local_scope_,_j,(N_Vector *)k);
  }
  else {
    lVar1 = **(long **)*in_R8;
    if ((((sunrealtype *)*in_RCX != in_R8) || (*in_RDX != 1.0)) || (NAN(*in_RDX))) {
      if ((sunrealtype *)*in_RCX == in_R8) {
        for (iVar6 = 0; iVar6 < in_EDI; iVar6 = iVar6 + 1) {
          lVar2 = *(long *)(*(long *)in_R8[iVar6] + 0x10);
          for (lVar5 = 0; lVar5 < lVar1; lVar5 = lVar5 + 1) {
            *(double *)(lVar2 + lVar5 * 8) = *in_RDX * *(double *)(lVar2 + lVar5 * 8);
          }
          for (iVar7 = 1; iVar7 < in_ESI; iVar7 = iVar7 + 1) {
            lVar5 = *(long *)(**(long **)(in_RCX[iVar7] + (long)iVar6 * 8) + 0x10);
            for (lVar4 = 0; lVar4 < lVar1; lVar4 = lVar4 + 1) {
              *(double *)(lVar2 + lVar4 * 8) =
                   in_RDX[iVar7] * *(double *)(lVar5 + lVar4 * 8) + *(double *)(lVar2 + lVar4 * 8);
            }
          }
        }
      }
      else {
        for (iVar6 = 0; iVar6 < in_EDI; iVar6 = iVar6 + 1) {
          lVar2 = *(long *)(**(long **)(*in_RCX + (long)iVar6 * 8) + 0x10);
          lVar5 = *(long *)(*(long *)in_R8[iVar6] + 0x10);
          for (lVar4 = 0; lVar4 < lVar1; lVar4 = lVar4 + 1) {
            *(double *)(lVar5 + lVar4 * 8) = *in_RDX * *(double *)(lVar2 + lVar4 * 8);
          }
          for (iVar7 = 1; iVar7 < in_ESI; iVar7 = iVar7 + 1) {
            lVar2 = *(long *)(**(long **)(in_RCX[iVar7] + (long)iVar6 * 8) + 0x10);
            for (lVar4 = 0; lVar4 < lVar1; lVar4 = lVar4 + 1) {
              *(double *)(lVar5 + lVar4 * 8) =
                   in_RDX[iVar7] * *(double *)(lVar2 + lVar4 * 8) + *(double *)(lVar5 + lVar4 * 8);
            }
          }
        }
      }
    }
    else {
      for (iVar6 = 0; iVar6 < in_EDI; iVar6 = iVar6 + 1) {
        lVar2 = *(long *)(*(long *)in_R8[iVar6] + 0x10);
        for (iVar7 = 1; iVar7 < in_ESI; iVar7 = iVar7 + 1) {
          lVar5 = *(long *)(**(long **)(in_RCX[iVar7] + (long)iVar6 * 8) + 0x10);
          for (lVar4 = 0; lVar4 < lVar1; lVar4 = lVar4 + 1) {
            *(double *)(lVar2 + lVar4 * 8) =
                 in_RDX[iVar7] * *(double *)(lVar5 + lVar4 * 8) + *(double *)(lVar2 + lVar4 * 8);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VLinearCombinationVectorArray_Serial(int nvec, int nsum,
                                                  sunrealtype* c, N_Vector** X,
                                                  N_Vector* Z)
{
  SUNFunctionBegin(X[0][0]->sunctx);
  int i;          /* vector arrays index in summation [0,nsum) */
  int j;          /* vector index in vector array     [0,nvec) */
  sunindextype k; /* element index in vector          [0,N)    */
  sunindextype N;
  sunrealtype* zd = NULL;
  sunrealtype* xd = NULL;
  sunrealtype* ctmp;
  N_Vector* Y;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1 && nsum >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* ---------------------------
   * Special cases for nvec == 1
   * --------------------------- */

  if (nvec == 1)
  {
    /* should have called N_VScale */
    if (nsum == 1)
    {
      N_VScale_Serial(c[0], X[0][0], Z[0]);
      SUNCheckLastErr();
      return SUN_SUCCESS;
    }

    /* should have called N_VLinearSum */
    if (nsum == 2)
    {
      N_VLinearSum_Serial(c[0], X[0][0], c[1], X[1][0], Z[0]);
      SUNCheckLastErr();
      return SUN_SUCCESS;
    }

    /* should have called N_VLinearCombination */
    Y = (N_Vector*)malloc(nsum * sizeof(N_Vector));
    SUNAssert(Y, SUN_ERR_MALLOC_FAIL);

    for (i = 0; i < nsum; i++) { Y[i] = X[i][0]; }

    SUNCheckCall(N_VLinearCombination_Serial(nsum, c, Y, Z[0]));

    free(Y);

    return SUN_SUCCESS;
  }

  /* --------------------------
   * Special cases for nvec > 1
   * -------------------------- */

  /* should have called N_VScaleVectorArray */
  if (nsum == 1)
  {
    ctmp = (sunrealtype*)malloc(nvec * sizeof(sunrealtype));
    SUNAssert(ctmp, SUN_ERR_MALLOC_FAIL);

    for (j = 0; j < nvec; j++) { ctmp[j] = c[0]; }

    SUNCheckCall(N_VScaleVectorArray_Serial(nvec, ctmp, X[0], Z));

    free(ctmp);
    return SUN_SUCCESS;
  }

  /* should have called N_VLinearSumVectorArray */
  if (nsum == 2)
  {
    SUNCheckCall(N_VLinearSumVectorArray_Serial(nvec, c[0], X[0], c[1], X[1], Z));
    return SUN_SUCCESS;
  }

  /* --------------------------
   * Compute linear combination
   * -------------------------- */

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /*
   * X[0][j] += c[i]*X[i][j], i = 1,...,nvec-1
   */
  if ((X[0] == Z) && (c[0] == ONE))
  {
    for (j = 0; j < nvec; j++)
    {
      zd = NV_DATA_S(Z[j]);
      for (i = 1; i < nsum; i++)
      {
        xd = NV_DATA_S(X[i][j]);
        for (k = 0; k < N; k++) { zd[k] += c[i] * xd[k]; }
      }
    }
    return SUN_SUCCESS;
  }

  /*
   * X[0][j] = c[0] * X[0][j] + sum{ c[i] * X[i][j] }, i = 1,...,nvec-1
   */
  if (X[0] == Z)
  {
    for (j = 0; j < nvec; j++)
    {
      zd = NV_DATA_S(Z[j]);
      for (k = 0; k < N; k++) { zd[k] *= c[0]; }
      for (i = 1; i < nsum; i++)
      {
        xd = NV_DATA_S(X[i][j]);
        for (k = 0; k < N; k++) { zd[k] += c[i] * xd[k]; }
      }
    }
    return SUN_SUCCESS;
  }

  /*
   * Z[j] = sum{ c[i] * X[i][j] }, i = 0,...,nvec-1
   */
  for (j = 0; j < nvec; j++)
  {
    xd = NV_DATA_S(X[0][j]);
    zd = NV_DATA_S(Z[j]);
    for (k = 0; k < N; k++) { zd[k] = c[0] * xd[k]; }
    for (i = 1; i < nsum; i++)
    {
      xd = NV_DATA_S(X[i][j]);
      for (k = 0; k < N; k++) { zd[k] += c[i] * xd[k]; }
    }
  }
  return SUN_SUCCESS;
}